

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dohdata *pdVar1;
  DOHcode DVar2;
  uchar *doh;
  size_t dohlen;
  char *pcVar3;
  char *pcVar4;
  Curl_addrinfo *addr;
  Curl_dns_entry *pCVar5;
  long lVar6;
  Curl_addrinfo *ai;
  Curl_dns_entry *dns;
  dnsprobe *p;
  undefined1 local_2a8 [4];
  int slot;
  dohentry de;
  DOHcode rc [2];
  dohdata *dohp;
  CURLcode result;
  Curl_dns_entry **dnsp_local;
  Curl_easy *data_local;
  
  pdVar1 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar1 == (dohdata *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar1->probe[0].easy == (CURL_conflict *)0x0) &&
          (pdVar1->probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    data_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
    if ((*(uint *)&(data->conn->bits).field_0x4 >> 5 & 1) != 0) {
      data_local._4_4_ = CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else if (pdVar1->pending == 0) {
    memset(&de.numcname,0,8);
    for (p._4_4_ = 0; p._4_4_ < 2; p._4_4_ = p._4_4_ + 1) {
      curl_multi_remove_handle(data->multi,pdVar1->probe[p._4_4_].easy);
      Curl_close(&pdVar1->probe[p._4_4_].easy);
    }
    de_init((dohentry *)local_2a8);
    for (p._4_4_ = 0; p._4_4_ < 2; p._4_4_ = p._4_4_ + 1) {
      lVar6 = (long)p._4_4_;
      if (pdVar1->probe[lVar6].dnstype != 0) {
        doh = Curl_dyn_uptr(&pdVar1->probe[lVar6].serverdoh);
        dohlen = Curl_dyn_len(&pdVar1->probe[lVar6].serverdoh);
        DVar2 = doh_decode(doh,dohlen,pdVar1->probe[lVar6].dnstype,(dohentry *)local_2a8);
        rc[(long)p._4_4_ + -2] = DVar2;
        Curl_dyn_free(&pdVar1->probe[lVar6].serverdoh);
        if (rc[(long)p._4_4_ + -2] != DOH_OK) {
          pcVar3 = doh_strerror(rc[(long)p._4_4_ + -2]);
          pcVar4 = type2name(pdVar1->probe[lVar6].dnstype);
          Curl_infof(data,"DoH: %s type %s for %s",pcVar3,pcVar4,pdVar1->host);
        }
      }
    }
    dohp._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
    if ((de.numcname == 0) || (de._620_4_ == 0)) {
      Curl_infof(data,"DoH Host name: %s",pdVar1->host);
      showdoh(data,(dohentry *)local_2a8);
      addr = doh2ai((dohentry *)local_2a8,pdVar1->host,pdVar1->port);
      if (addr == (Curl_addrinfo *)0x0) {
        de_cleanup((dohentry *)local_2a8);
        return CURLE_OUT_OF_MEMORY;
      }
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCVar5 = Curl_cache_addr(data,addr,pdVar1->host,pdVar1->port);
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      if (pCVar5 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(addr);
      }
      else {
        (data->state).async.dns = pCVar5;
        *dnsp = pCVar5;
        dohp._4_4_ = CURLE_OK;
      }
    }
    de_cleanup((dohentry *)local_2a8);
    (*Curl_cfree)((data->req).doh);
    (data->req).doh = (dohdata *)0x0;
    data_local._4_4_ = dohp._4_4_;
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn)?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DoH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DoH Host name: %s", dohp->host);
      showdoh(data, &de);

      ai = doh2ai(&de, dohp->host, dohp->port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}